

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O0

void __thiscall
so_5::coop_t::do_add_agent
          (coop_t *this,agent_ref_t *agent_ref,disp_binder_unique_ptr_t *disp_binder)

{
  pointer __p;
  element_type *peVar1;
  agent_t *paVar2;
  exception_t *this_00;
  agent_with_disp_binder_t local_80;
  undefined1 local_62;
  allocator local_61;
  string local_60 [48];
  undefined1 local_30 [8];
  disp_binder_ref_t dbinder;
  disp_binder_unique_ptr_t *disp_binder_local;
  agent_ref_t *agent_ref_local;
  coop_t *this_local;
  
  dbinder.super___shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)disp_binder;
  __p = std::unique_ptr<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>::release
                  (disp_binder);
  std::shared_ptr<so_5::disp_binder_t>::shared_ptr<so_5::disp_binder_t,void>
            ((shared_ptr<so_5::disp_binder_t> *)local_30,__p);
  peVar1 = std::__shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  if (peVar1 != (element_type *)0x0) {
    paVar2 = intrusive_ptr_t<so_5::agent_t>::get(agent_ref);
    if (paVar2 != (agent_t *)0x0) {
      agent_with_disp_binder_t::agent_with_disp_binder_t
                (&local_80,agent_ref,(disp_binder_ref_t *)local_30);
      std::
      vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
      ::push_back(&this->m_agent_array,&local_80);
      agent_with_disp_binder_t::~agent_with_disp_binder_t(&local_80);
      std::shared_ptr<so_5::disp_binder_t>::~shared_ptr((shared_ptr<so_5::disp_binder_t> *)local_30)
      ;
      return;
    }
  }
  local_62 = 1;
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"zero ptr to agent or disp binder",&local_61);
  exception_t::exception_t(this_00,(string *)local_60,0x16);
  local_62 = 0;
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

void
coop_t::do_add_agent(
	const agent_ref_t & agent_ref,
	disp_binder_unique_ptr_t disp_binder )
{
	disp_binder_ref_t dbinder( disp_binder.release() );

	if( nullptr == dbinder.get() || nullptr == agent_ref.get() )
		throw exception_t(
			"zero ptr to agent or disp binder",
			rc_coop_has_references_to_null_agents_or_binders );

	m_agent_array.push_back(
		agent_with_disp_binder_t( agent_ref, dbinder ) );
}